

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chars.cpp
# Opt level: O0

BuiltinFunction *
char_predicate(BuiltinFunction *__return_storage_ptr__,string *name,_func_int_int *fun)

{
  anon_class_40_2_65dcc395 local_50;
  int local_28 [2];
  _func_int_int *local_20;
  _func_int_int *fun_local;
  string *name_local;
  
  local_28[1] = 1;
  local_28[0] = 1;
  local_20 = fun;
  fun_local = (_func_int_int *)name;
  name_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  local_50.fun = local_20;
  std::
  tuple<long_long,_long_long,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>_&)>_>
  ::
  tuple<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kalinochkind[P]scheme_src_std_builtins_chars_cpp:6:19),_true,_true>
            (__return_storage_ptr__,local_28 + 1,local_28,&local_50);
  char_predicate(std::__cxx11::string_const&,int(*)(int))::$_0::~__0((__0 *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static BuiltinFunction char_predicate(const std::string &name, int (*fun)(int))
{
    return {1, 1, [name, fun](const std::list<std::shared_ptr<SchemeObject>> &l) {
        auto p = std::dynamic_pointer_cast<SchemeChar>(l.front());
        if(!p)
            throw eval_error(name + ": a char required");
        return fun(p->value) ? scheme_true : scheme_false;
    }};
}